

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

bool __thiscall
cashew::JSPrinter::needParens(JSPrinter *this,Ref parent,Ref child,int childPosition)

{
  bool bVar1;
  int prec;
  int iVar2;
  Ref *pRVar3;
  Ref *pRVar4;
  Ref local_40;
  Ref child_local;
  Ref parent_local;
  
  local_40.inst = child.inst;
  child_local = parent;
  prec = getPrecedence(this,parent,true);
  iVar2 = getPrecedence(this,child,false);
  if (prec < iVar2) {
    return true;
  }
  if (iVar2 < prec) {
    return false;
  }
  if ((parent.inst)->type == Array) {
    pRVar3 = Ref::operator[](&child_local,0);
    bVar1 = Ref::operator==(pRVar3,(IString *)UNARY_PREFIX);
    if (bVar1) {
      pRVar3 = Ref::operator[](&local_40,0);
      bVar1 = Ref::operator==(pRVar3,(IString *)UNARY_PREFIX);
      if (!bVar1) {
        __assert_fail("child[0] == UNARY_PREFIX",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0x471,"bool cashew::JSPrinter::needParens(Ref, Ref, int)");
      }
      pRVar3 = Ref::operator[](&child_local,1);
      bVar1 = Ref::operator==(pRVar3,(IString *)&PLUS);
      if (!bVar1) {
        pRVar3 = Ref::operator[](&child_local,1);
        bVar1 = Ref::operator==(pRVar3,(IString *)&MINUS);
        if (!bVar1) goto LAB_00d44d82;
      }
      pRVar3 = Ref::operator[](&local_40,1);
      pRVar4 = Ref::operator[](&child_local,1);
      bVar1 = Ref::operator==(pRVar3,pRVar4->inst);
      if (childPosition == 0) {
        return true;
      }
      if (bVar1) {
        return true;
      }
      goto LAB_00d44d8a;
    }
  }
LAB_00d44d82:
  if (childPosition == 0) {
    return true;
  }
LAB_00d44d8a:
  if (iVar2 < 0) {
    return false;
  }
  bVar1 = OperatorClass::getRtl(prec);
  if (!bVar1) {
    return 0 < childPosition;
  }
  return SUB41((uint)childPosition >> 0x1f,0);
}

Assistant:

bool needParens(Ref parent, Ref child, int childPosition) {
    int parentPrecedence = getPrecedence(parent, true);
    int childPrecedence = getPrecedence(child, false);

    if (childPrecedence > parentPrecedence) {
      return true; // child is definitely a danger
    }
    if (childPrecedence < parentPrecedence) {
      return false; //          definitely cool
    }
    // equal precedence, so associativity (rtl/ltr) is what matters
    // (except for some exceptions, where multiple operators can combine into
    // confusion)
    if (parent->isArray() && parent[0] == UNARY_PREFIX) {
      assert(child[0] == UNARY_PREFIX);
      if ((parent[1] == PLUS || parent[1] == MINUS) && child[1] == parent[1]) {
        // cannot emit ++x when we mean +(+x)
        return true;
      }
    }
    if (childPosition == 0) {
      return true; // child could be anywhere, so always paren
    }
    if (childPrecedence < 0) {
      return false; // both precedences are safe
    }
    // check if child is on the dangerous side
    if (OperatorClass::getRtl(parentPrecedence)) {
      return childPosition < 0;
    } else {
      return childPosition > 0;
    }
  }